

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O1

void __thiscall
slang::ast::RangeSelectExpression::serializeTo
          (RangeSelectExpression *this,ASTSerializer *serializer)

{
  size_t __n;
  
  __n = strlen(*(char **)(toString(slang::ast::RangeSelectionKind)::strings +
                         (long)(int)this->selectionKind * 8));
  ASTSerializer::write(serializer,0xd,"selectionKind",__n);
  ASTSerializer::write(serializer,5,"value",(size_t)this->value_);
  ASTSerializer::write(serializer,4,"left",(size_t)this->left_);
  ASTSerializer::write(serializer,5,"right",(size_t)this->right_);
  return;
}

Assistant:

void RangeSelectExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("selectionKind", toString(selectionKind));
    serializer.write("value", value());
    serializer.write("left", left());
    serializer.write("right", right());
}